

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::sPolynomial12
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  Index in_stack_fffffffffffffdf8;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_fffffffffffffe00;
  
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,0x9d8be6);
  row = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_fffffffffffffe00,(Index)row,0x9d8c06);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)(row / *pSVar5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8c2c);
  *pSVar5 = (Scalar)this;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8c4d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8c6e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8c95);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8cb6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8cee);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8d15);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8d36);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8d6e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8d95);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8db6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8dd7);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8dfe);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8e1f);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8e50);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8e71);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8e92);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8eb9);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8eda);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8efb);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8f22);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8f43);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8f7e);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8fab);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8fcf);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d8ff3);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9020);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9044);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d907f);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d90ac);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d90d0);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d910b);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9138);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d915c);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9180);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d91ad);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d91d1);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d920b);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d922f);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9253);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9280);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d92a4);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d92c8);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d92f5);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9319);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9354);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9381);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d93a5);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d93c9);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d93f6);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d941a);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9455);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9482);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d94a6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d94ca);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d94f7);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d951b);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9556);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9583);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d95a7);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d95e2);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d960f);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9633);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9657);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9684);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d96a8);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d96e2);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9706);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d972a);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9757);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d977b);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d979f);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d97cc);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d97f0);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d982b);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9858);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d987c);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d98a0);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d98cd);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d98f1);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d992c);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9959);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d997d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d99a1);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d99ce);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d99f2);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9a2d);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9a5a);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9a7e);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9aa2);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,(Index)row,0x9d9acf);
  *pSVar5 = dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial12( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(12,32) = groebnerMatrix(8,63)/(groebnerMatrix(8,62));
  groebnerMatrix(12,33) = groebnerMatrix(8,64)/(groebnerMatrix(8,62));
  groebnerMatrix(12,34) = -groebnerMatrix(10,65)/(groebnerMatrix(10,64));
  groebnerMatrix(12,35) = -groebnerMatrix(10,66)/(groebnerMatrix(10,64));
  groebnerMatrix(12,37) = (groebnerMatrix(8,65)/(groebnerMatrix(8,62))-groebnerMatrix(10,67)/(groebnerMatrix(10,64)));
  groebnerMatrix(12,38) = groebnerMatrix(8,66)/(groebnerMatrix(8,62));
  groebnerMatrix(12,39) = groebnerMatrix(8,67)/(groebnerMatrix(8,62));
  groebnerMatrix(12,40) = -groebnerMatrix(10,68)/(groebnerMatrix(10,64));
  groebnerMatrix(12,42) = groebnerMatrix(8,68)/(groebnerMatrix(8,62));
  groebnerMatrix(12,44) = -groebnerMatrix(10,69)/(groebnerMatrix(10,64));
  groebnerMatrix(12,45) = -groebnerMatrix(10,70)/(groebnerMatrix(10,64));
  groebnerMatrix(12,47) = (groebnerMatrix(8,69)/(groebnerMatrix(8,62))-groebnerMatrix(10,71)/(groebnerMatrix(10,64)));
  groebnerMatrix(12,48) = groebnerMatrix(8,70)/(groebnerMatrix(8,62));
  groebnerMatrix(12,49) = groebnerMatrix(8,71)/(groebnerMatrix(8,62));
  groebnerMatrix(12,50) = -groebnerMatrix(10,72)/(groebnerMatrix(10,64));
  groebnerMatrix(12,52) = groebnerMatrix(8,72)/(groebnerMatrix(8,62));
  groebnerMatrix(12,54) = -groebnerMatrix(10,73)/(groebnerMatrix(10,64));
  groebnerMatrix(12,56) = groebnerMatrix(8,73)/(groebnerMatrix(8,62));
  groebnerMatrix(12,59) = -groebnerMatrix(10,74)/(groebnerMatrix(10,64));
  groebnerMatrix(12,60) = -groebnerMatrix(10,75)/(groebnerMatrix(10,64));
  groebnerMatrix(12,62) = (groebnerMatrix(8,74)/(groebnerMatrix(8,62))-groebnerMatrix(10,76)/(groebnerMatrix(10,64)));
  groebnerMatrix(12,63) = groebnerMatrix(8,75)/(groebnerMatrix(8,62));
  groebnerMatrix(12,64) = groebnerMatrix(8,76)/(groebnerMatrix(8,62));
  groebnerMatrix(12,65) = -groebnerMatrix(10,77)/(groebnerMatrix(10,64));
  groebnerMatrix(12,67) = groebnerMatrix(8,77)/(groebnerMatrix(8,62));
  groebnerMatrix(12,69) = -groebnerMatrix(10,78)/(groebnerMatrix(10,64));
  groebnerMatrix(12,71) = groebnerMatrix(8,78)/(groebnerMatrix(8,62));
  groebnerMatrix(12,74) = -groebnerMatrix(10,79)/(groebnerMatrix(10,64));
  groebnerMatrix(12,76) = groebnerMatrix(8,79)/(groebnerMatrix(8,62));
}